

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O3

DictUnit * __thiscall cppjieba::Trie::Find(Trie *this,const_iterator begin,const_iterator end)

{
  TrieNode *pTVar1;
  iterator iVar2;
  DictUnit *pDVar3;
  const_iterator it;
  
  if (begin == end) {
    pDVar3 = (DictUnit *)0x0;
  }
  else {
    pTVar1 = this->root_;
    do {
      if (&pTVar1->next->_M_h ==
          (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)0x0) {
        return (DictUnit *)0x0;
      }
      iVar2 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&pTVar1->next->_M_h,&begin->rune);
      if (iVar2.
          super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
          _M_cur == (__node_type *)0x0) {
        return (DictUnit *)0x0;
      }
      begin = begin + 1;
      pTVar1 = *(TrieNode **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                       ._M_cur + 0x10);
    } while (begin != end);
    pDVar3 = pTVar1->ptValue;
  }
  return pDVar3;
}

Assistant:

const DictUnit* Find(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end) const {
    if (begin == end) {
      return NULL;
    }

    const TrieNode* ptNode = root_;
    TrieNode::NextMap::const_iterator citer;
    for (RuneStrArray::const_iterator it = begin; it != end; it++) {
      if (NULL == ptNode->next) {
        return NULL;
      }
      citer = ptNode->next->find(it->rune);
      if (ptNode->next->end() == citer) {
        return NULL;
      }
      ptNode = citer->second;
    }
    return ptNode->ptValue;
  }